

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::internal::LazyDescriptor::OnceInternal(LazyDescriptor *this)

{
  LogMessage *other;
  Symbol SVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (this->file_[0xb8] == (FileDescriptor)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1ab9);
    other = LogMessage::operator<<(&local_48,"CHECK failed: file_->finished_building_: ");
    LogFinisher::operator=(&local_49,other);
    LogMessage::~LogMessage(&local_48);
  }
  if ((this->descriptor_ == (Descriptor *)0x0) && (this->name_ != (string *)0x0)) {
    SVar1 = DescriptorPool::CrossLinkOnDemandHelper
                      (*(DescriptorPool **)(this->file_ + 0x10),this->name_,false);
    if (SVar1.type == MESSAGE) {
      this->descriptor_ = (Descriptor *)SVar1.field_1;
    }
  }
  return;
}

Assistant:

void LazyDescriptor::OnceInternal() {
  GOOGLE_CHECK(file_->finished_building_);
  if (!descriptor_ && name_) {
    Symbol result = file_->pool_->CrossLinkOnDemandHelper(*name_, false);
    if (!result.IsNull() && result.type == Symbol::MESSAGE) {
      descriptor_ = result.descriptor;
    }
  }
}